

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

void ucase_addPropertyStarts_63(USetAdder *sa,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UErrorCode *pErrorCode_local;
  USetAdder *sa_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    utrie2_enum_63(&ucase_props_singleton.trie,(UTrie2EnumValue *)0x0,_enumPropertyStartsRange,sa);
  }
  return;
}

Assistant:

U_CFUNC void U_EXPORT2
ucase_addPropertyStarts(const USetAdder *sa, UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return;
    }

    /* add the start code point of each same-value range of the trie */
    utrie2_enum(&ucase_props_singleton.trie, NULL, _enumPropertyStartsRange, sa);

    /* add code points with hardcoded properties, plus the ones following them */

    /* (none right now, see comment below) */

    /*
     * Omit code points with hardcoded specialcasing properties
     * because we do not build property UnicodeSets for them right now.
     */
}